

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

Table * luaH_new(lua_State *L)

{
  Table *t_00;
  Table *t;
  GCObject *o;
  lua_State *L_local;
  
  t_00 = (Table *)luaC_newobj(L,5,0x38);
  t_00->metatable = (Table *)0x0;
  t_00->flags = 0xff;
  t_00->array = (TValue *)0x0;
  t_00->sizearray = 0;
  setnodevector(L,t_00,0);
  return t_00;
}

Assistant:

Table *luaH_new(lua_State *L) {
    GCObject *o = luaC_newobj(L, LUA_TTABLE, sizeof(Table));
    Table *t = gco2t(o);
    t->metatable = NULL;
    t->flags = cast_byte(~0);
    t->array = NULL;
    t->sizearray = 0;
    setnodevector(L, t, 0);
    return t;
}